

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsh.c
# Opt level: O1

void nsh_run(nsh_t *nsh)

{
  char cVar1;
  _Bool _Var2;
  uint uVar3;
  int iVar4;
  int iVar5;
  nsh_status_t nVar6;
  size_t sVar7;
  nsh_cmd_t *pnVar8;
  ulong uVar9;
  char *pcVar10;
  ulong extraout_RDX;
  ulong uVar11;
  ulong uVar12;
  ulong unaff_RBP;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  char *argv [32];
  char args [32] [16];
  char *local_648 [33];
  nsh_cmd_array_t local_540;
  char local_238 [520];
  
  memset(local_648,0,0x100);
  do {
    nsh_io_print_prompt();
    nsh->current_history_entry = 0xffffffff;
    nsh_line_buffer_reset(&nsh->line);
    do {
      cVar1 = nsh_io_get_char();
      switch(cVar1) {
      case '\b':
        _Var2 = nsh_line_buffer_is_empty(&nsh->line);
        if (!_Var2) {
          nsh_io_erase_last_char();
          nsh_line_buffer_erase_last_char(&nsh->line);
        }
        goto LAB_00101493;
      case '\t':
        nsh_cmd_array_init(&local_540);
        if ((nsh->cmds).count != 0) {
          uVar13 = 0;
          pnVar8 = (nsh->cmds).array;
          do {
            iVar4 = bcmp(nsh,pnVar8->name,(ulong)(nsh->line).size);
            if (iVar4 == 0) {
              uVar12 = (ulong)local_540.count;
              local_540.count = local_540.count + 1;
              nsh_cmd_copy(local_540.array + uVar12,pnVar8);
            }
            uVar13 = uVar13 + 1;
            pnVar8 = pnVar8 + 1;
          } while (uVar13 < (nsh->cmds).count);
        }
        if (local_540.count != 0) {
          nsh_cmd_array_lexicographic_sort(&local_540);
          nsh_io_put_newline();
          if (local_540.count != 0) {
            pcVar10 = local_540.array[0].name;
            uVar13 = 0;
            do {
              nsh_io_put_string(pcVar10);
              nsh_io_put_char(' ');
              uVar13 = uVar13 + 1;
              pcVar10 = pcVar10 + 0x18;
            } while (uVar13 < local_540.count);
          }
        }
        nsh_io_put_newline();
        nsh_io_print_prompt();
        nsh_io_put_buffer((char *)nsh,(nsh->line).size);
        bVar15 = false;
        break;
      case '\n':
      case '\r':
        nsh_line_buffer_append_null(&nsh->line);
        _Var2 = nsh_line_buffer_is_empty(&nsh->line);
        if (!_Var2) {
          nsh_history_add_entry(&nsh->history,(char *)nsh);
        }
        nsh_io_put_newline();
        bVar15 = true;
        unaff_RBP = 0;
        break;
      case '\v':
      case '\f':
switchD_001013c0_caseD_b:
        nsh_io_put_char(cVar1);
        nsh_line_buffer_append_char(&nsh->line,cVar1);
        _Var2 = nsh_line_buffer_is_full(&nsh->line);
        if (!_Var2) goto LAB_00101493;
        nsh_io_put_newline();
        nsh_io_put_string("WARNING: line buffer reach its maximum capacity\r\n");
        bVar15 = true;
        unaff_RBP = 4;
        break;
      default:
        if (cVar1 != '\x1b') goto switchD_001013c0_caseD_b;
        nsh_io_get_char();
        cVar1 = nsh_io_get_char();
        if (cVar1 == 'B') {
          uVar3 = nsh->current_history_entry;
          if (uVar3 < 0x10) {
LAB_00101428:
            nsh->current_history_entry = uVar3 - 1;
          }
        }
        else {
          if (cVar1 != 'A') goto LAB_00101493;
          nsh->current_history_entry = nsh->current_history_entry + 1;
          uVar3 = nsh_history_entry_count(&nsh->history);
          if (uVar3 <= nsh->current_history_entry) goto LAB_00101428;
        }
        nsh_display_history_entry(nsh);
LAB_00101493:
        bVar15 = false;
      }
    } while (!bVar15);
    if ((int)unaff_RBP == 0) {
      sVar7 = strlen((char *)nsh);
      iVar4 = (int)extraout_RDX;
      iVar5 = (int)sVar7;
      bVar15 = iVar5 != 0;
      if (iVar5 == 0) {
        uVar13 = 0;
        uVar12 = 0;
      }
      else {
        bVar15 = true;
        uVar13 = 0;
        uVar14 = 0;
        uVar12 = 0;
        uVar11 = extraout_RDX;
        do {
          if ((nsh->line).buffer[uVar14] == ' ') {
            uVar3 = (int)uVar14 - (int)uVar12;
            uVar9 = 4;
            if (uVar3 < 0x10) {
              unaff_RBP = (ulong)uVar3;
              memcpy(local_238 + uVar13 * 0x10,(nsh->line).buffer + uVar12,unaff_RBP);
              uVar11 = uVar11 & 0xffffffff;
              (local_238 + uVar13 * 0x10)[unaff_RBP] = '\0';
              uVar3 = (int)uVar13 + 1;
              uVar13 = (ulong)uVar3;
              uVar9 = (ulong)((uint)(0x1f < uVar3) * 9);
            }
            bVar16 = (int)uVar9 != 0;
            if (!bVar16) {
              uVar12 = (ulong)((int)uVar14 + 1);
            }
            uVar11 = uVar11 & 0xffffffff;
            if (bVar16) {
              uVar11 = uVar9;
            }
            iVar4 = (int)uVar11;
            if (bVar16) break;
          }
          iVar4 = (int)uVar11;
          uVar14 = uVar14 + 1;
          bVar15 = uVar14 < (sVar7 & 0xffffffff);
        } while (uVar14 != (sVar7 & 0xffffffff));
      }
      if (!bVar15) {
        uVar3 = iVar5 - (int)uVar12;
        iVar4 = 4;
        if (uVar3 < 0x10) {
          unaff_RBP = (ulong)uVar3;
          memcpy(local_238 + uVar13 * 0x10,(nsh->line).buffer + uVar12,unaff_RBP);
          (local_238 + uVar13 * 0x10)[unaff_RBP] = '\0';
          uVar3 = (int)uVar13 + 1;
          uVar13 = (ulong)uVar3;
          iVar4 = (uint)(0x1f < uVar3) * 9;
        }
      }
      iVar5 = 2;
      if (iVar4 == 0) {
        if ((uint)uVar13 != 0) {
          pcVar10 = local_238;
          uVar12 = 0;
          do {
            local_648[uVar12] = pcVar10;
            uVar12 = uVar12 + 1;
            pcVar10 = pcVar10 + 0x10;
          } while (uVar13 != uVar12);
        }
        unaff_RBP = 6;
        if ((local_648[0] != (char *)0x0) && (*local_648[0] != '\0')) {
          pnVar8 = nsh_cmd_array_find(&nsh->cmds,local_648[0]);
          if (pnVar8 == (nsh_cmd_t *)0x0) {
            unaff_RBP = 7;
          }
          else if (pnVar8->handler != (nsh_cmd_handler_t *)0x0) {
            nVar6 = (*pnVar8->handler)((uint)uVar13,local_648);
            unaff_RBP = (ulong)nVar6;
            nsh_io_printf("command \'%s\' return %d\r\n",local_648[0],(ulong)nVar6);
          }
        }
        if ((int)unaff_RBP == 1) {
          iVar5 = 3;
          bVar15 = false;
        }
        else {
          if ((int)unaff_RBP == 7) {
            nsh_io_put_string("ERROR: command \'");
            nsh_io_put_string(local_648[0]);
            nsh_io_put_string("\' not found\r\n");
          }
          iVar5 = 0;
          bVar15 = true;
        }
        if (bVar15) goto LAB_0010159f;
      }
    }
    else {
LAB_0010159f:
      iVar5 = 0;
    }
    if (iVar5 == 3) {
      return;
    }
  } while( true );
}

Assistant:

void nsh_run(nsh_t* nsh)
{
    // Local storage for command line after spliting
    char args[NSH_CMD_ARGS_MAX_COUNT][NSH_MAX_STRING_SIZE];

    /*
     * Array of pointers that points to the string contained by 'args'.
     *
     * In C/C++, an array decays to a pointer in most circumstances,
     * but this isn't recursive. So a T[] decays to a T*, but a T[][]
     * doesn't decay to a T**. Therefore we are forced to add an extra
     * step: char[][] -> char*[] -> char**
     */
    char* argv[NSH_CMD_ARGS_MAX_COUNT] = { NULL };

    while (true) {
        unsigned int argc = 0;

        nsh_io_print_prompt();

        // Read a command line and store it into 'nsh->line.buffer'
        nsh_status_t status = nsh_read_line(nsh);

        if (status == NSH_STATUS_OK) {
            // Split the command line into argument tokens
            if (nsh_split_command_line(nsh->line.buffer, ' ', args, &argc) != NSH_STATUS_OK) {
                // Ignore this command since there was an error
                // TODO just print a warning to the user
                continue;
            }

            // Copy the address of all tokens into 'argv'
            for (unsigned int i = 0; i < argc; i++) {
                argv[i] = args[i];
            }

            // Execute the command with 'argc' number of argument stored in 'argv'
            nsh_status_t cmd_status = nsh_execute(nsh, argc, argv);
            if (cmd_status == NSH_STATUS_CMD_NOT_FOUND) {
                nsh_io_put_string("ERROR: command '");
                nsh_io_put_string(argv[0]);
                nsh_io_put_string("' not found\r\n");
            } else if (cmd_status == NSH_STATUS_QUIT) {
                break;
            }
        }
    }
}